

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O3

VOID InternalDeleteCriticalSection(PCRITICAL_SECTION pCriticalSection)

{
  long lVar1;
  long *plVar2;
  BOOL BVar3;
  uint uVar4;
  CPalThread *pCurrentThread;
  HANDLE pVVar5;
  char *in_RSI;
  long *plVar6;
  
  if ((pCriticalSection->dwInitState != 1) && (pCriticalSection->dwInitState != 3)) {
    fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x169);
    in_RSI = 
    "Expression: PalCsUserInitialized == pPalCriticalSection->cisInitState || PalCsFullyInitialized == pPalCriticalSection->cisInitState, Description: CS %p is not initialized"
    ;
    fprintf(_stderr,
            "Expression: PalCsUserInitialized == pPalCriticalSection->cisInitState || PalCsFullyInitialized == pPalCriticalSection->cisInitState, Description: CS %p is not initialized"
            ,pCriticalSection);
  }
  BVar3 = PALIsThreadDataInitialized();
  if (BVar3 == 0) {
    pCurrentThread = (CPalThread *)0x0;
  }
  else {
    pCurrentThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  }
  if (pCriticalSection->LockCount != 0) {
    pVVar5 = (HANDLE)ObtainCurrentThreadIdImpl(pCurrentThread,in_RSI);
    if (((pCriticalSection->LockCount & 1U) == 0) || (pVVar5 == pCriticalSection->OwningThread)) {
      if (PAL_InitializeChakraCoreCalled == false) {
        abort();
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x17c);
      fprintf(_stderr,"Thread tid=%u deleting a CS owned by thread tid=%u\n",pVVar5,
              pCriticalSection->OwningThread);
    }
  }
  plVar6 = (long *)pCriticalSection->DebugInfo;
  if (plVar6 == (long *)0x0) goto LAB_00349f29;
  if (pCriticalSection == (PCRITICAL_SECTION)&CorUnix::g_csPALCSsListLock) {
    lVar1 = *plVar6;
    plVar2 = (long *)plVar6[1];
    *plVar2 = lVar1;
    *(long **)(lVar1 + 8) = plVar2;
LAB_00349f1d:
    CorUnix::InternalFree(plVar6);
  }
  else {
    CorUnix::InternalEnterCriticalSection
              (pCurrentThread,(PCRITICAL_SECTION)&CorUnix::g_csPALCSsListLock);
    lVar1 = *pCriticalSection->DebugInfo;
    plVar6 = *(long **)((long)pCriticalSection->DebugInfo + 8);
    *plVar6 = lVar1;
    *(long **)(lVar1 + 8) = plVar6;
    CorUnix::InternalLeaveCriticalSection
              (pCurrentThread,(PCRITICAL_SECTION)&CorUnix::g_csPALCSsListLock);
    plVar6 = (long *)pCriticalSection->DebugInfo;
    if (plVar6 != (long *)0x0) goto LAB_00349f1d;
  }
  pCriticalSection->DebugInfo = (PVOID)0x0;
LAB_00349f29:
  if (pCriticalSection->dwInitState == 3) {
    uVar4 = pthread_cond_destroy((pthread_cond_t *)((long)&pCriticalSection->csnds + 0x28));
    if (uVar4 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x1dd);
      fprintf(_stderr,
              "Expression: 0 == iRet, Description: Failed destroying condition in CS @ %p [err=%d]\n"
              ,pCriticalSection,(ulong)uVar4);
    }
    uVar4 = pthread_mutex_destroy((pthread_mutex_t *)&pCriticalSection->csnds);
    if (uVar4 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x1e2);
      fprintf(_stderr,
              "Expression: 0 == iRet, Description: Failed destroying mutex in CS @ %p [err=%d]\n",
              pCriticalSection,(ulong)uVar4);
    }
  }
  pCriticalSection->dwInitState = 0;
  return;
}

Assistant:

VOID InternalDeleteCriticalSection(
    PCRITICAL_SECTION pCriticalSection)
{
    PAL_CRITICAL_SECTION * pPalCriticalSection =
        reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

    _ASSERT_MSG(PalCsUserInitialized == pPalCriticalSection->cisInitState ||
                PalCsFullyInitialized == pPalCriticalSection->cisInitState,
                "CS %p is not initialized", pPalCriticalSection);

#ifdef _DEBUG
    CPalThread * pThread =
        (PALIsThreadDataInitialized() ? GetCurrentPalThread() : NULL);

    if (0 != pPalCriticalSection->LockCount)
    {
        SIZE_T tid;
        tid = ObtainCurrentThreadId(pThread);
        int iWaiterCount = (int)PALCS_GETWCOUNT(pPalCriticalSection->LockCount);

        if (0 != (PALCS_LOCK_BIT & pPalCriticalSection->LockCount))
        {
            // CS is locked
            if (tid != pPalCriticalSection->OwningThread)
            {
                // not owner
                ASSERT("Thread tid=%u deleting a CS owned by thread tid=%u\n",
                       tid, pPalCriticalSection->OwningThread);
            }
            else
            {
                // owner
                if (0 != iWaiterCount)
                {
                    ERROR("Thread tid=%u is deleting a CS with %d threads waiting on it\n",
                          tid, iWaiterCount);
                }
                else
                {
                    WARN("Thread tid=%u is deleting a critical section it still owns\n",
                         tid);
                }
            }
        }
        else
        {
            // CS is not locked
            if (0 != iWaiterCount)
            {
                ERROR("Deleting a CS with %d threads waiting on it\n",
                      iWaiterCount);
            }
            else
            {
                ERROR("Thread tid=%u is deleting a critical section currently not "
                      "owned, but with one waiter awakened\n", tid);
            }
        }
    }

    if (NULL != pPalCriticalSection->DebugInfo)
    {
        if (pPalCriticalSection != &CorUnix::g_csPALCSsListLock)
        {
            InternalEnterCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
            RemoveEntryList(&pPalCriticalSection->DebugInfo->Link);
            InternalLeaveCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
        }
        else
        {
            RemoveEntryList(&pPalCriticalSection->DebugInfo->Link);
        }

#ifdef PAL_TRACK_CRITICAL_SECTIONS_DATA
        LONG lVal, lNewVal;
        Volatile<LONG> * plDest;

        // Update delete count
        InterlockedIncrement(pPalCriticalSection->fInternal ?
            &g_lPALCSInternalDeleteCount : &g_lPALCSDeleteCount);

        // Update acquire count
        plDest = pPalCriticalSection->fInternal ?
            &g_lPALCSInternalAcquireCount : &g_lPALCSAcquireCount;
        do {
            lVal = *plDest;
            lNewVal = lVal + pPalCriticalSection->DebugInfo->lAcquireCount;
            lNewVal = InterlockedCompareExchange(plDest, lNewVal, lVal);
        } while (lVal != lNewVal);

        // Update enter count
        plDest = pPalCriticalSection->fInternal ?
            &g_lPALCSInternalEnterCount : &g_lPALCSEnterCount;
        do {
            lVal = *plDest;
            lNewVal = lVal + pPalCriticalSection->DebugInfo->lEnterCount;
            lNewVal = InterlockedCompareExchange(plDest, lNewVal, lVal);
        } while (lVal != lNewVal);

        // Update contention count
        plDest = pPalCriticalSection->fInternal ?
            &g_lPALCSInternalContentionCount : &g_lPALCSContentionCount;
        do {
            lVal = *plDest;
            lNewVal = lVal + pPalCriticalSection->DebugInfo->lContentionCount;
            lNewVal = InterlockedCompareExchange(plDest, lNewVal, lVal);
        } while (lVal != lNewVal);

#endif // PAL_TRACK_CRITICAL_SECTIONS_DATA

        InternalDelete(pPalCriticalSection->DebugInfo);
        pPalCriticalSection->DebugInfo = NULL;
    }
#endif // _DEBUG

    if (PalCsFullyInitialized == pPalCriticalSection->cisInitState)
    {
        int iRet;

        // destroy condition
        iRet = pthread_cond_destroy(&pPalCriticalSection->csndNativeData.condition);
        _ASSERT_MSG(0 == iRet, "Failed destroying condition in CS @ %p "
                    "[err=%d]\n", pPalCriticalSection, iRet);

        // destroy mutex
        iRet = pthread_mutex_destroy(&pPalCriticalSection->csndNativeData.mutex);
        _ASSERT_MSG(0 == iRet, "Failed destroying mutex in CS @ %p "
                    "[err=%d]\n", pPalCriticalSection, iRet);
    }

    // Reset critical section state
    pPalCriticalSection->cisInitState = PalCsNotInitialized;
}